

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_array2d.h
# Opt level: O2

int __thiscall TNT::Array2D<double>::copy(Array2D<double> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  long lVar1;
  double **ppdVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int j;
  ulong uVar6;
  
  Array2D(this,*(int *)(dst + 0x40),*(int *)(dst + 0x44));
  uVar4 = 0;
  uVar3 = (ulong)*(uint *)(dst + 0x44);
  if ((int)*(uint *)(dst + 0x44) < 1) {
    uVar3 = uVar4;
  }
  uVar5 = (ulong)*(uint *)(dst + 0x40);
  if ((int)*(uint *)(dst + 0x40) < 1) {
    uVar5 = uVar4;
  }
  for (; uVar4 != uVar5; uVar4 = uVar4 + 1) {
    lVar1 = *(long *)(dst + 0x38);
    ppdVar2 = (this->v_).data_;
    for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
      ppdVar2[uVar4][uVar6] = *(double *)(*(long *)(lVar1 + uVar4 * 8) + uVar6 * 8);
    }
  }
  return (int)this;
}

Assistant:

Array2D<T> Array2D<T>::copy() const
{
	Array2D A(m_, n_);

	for (int i=0; i<m_; i++)
		for (int j=0; j<n_; j++)
			A[i][j] = v_[i][j];


	return A;
}